

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::
     genericCheckTestMessage<capnproto_test::capnp::test::TestDefaults::Builder>(Builder reader)

{
  Builder reader_00;
  Builder reader_01;
  Builder reader_02;
  Builder reader_03;
  Builder reader_04;
  Builder reader_05;
  Builder reader_06;
  Builder reader_07;
  Builder reader_08;
  Builder reader_09;
  Builder reader_10;
  Builder reader_11;
  Builder reader_12;
  Builder reader_13;
  Builder reader_14;
  Builder reader_15;
  Builder reader_16;
  Builder reader_17;
  Builder reader_18;
  Builder reader_19;
  Builder reader_20;
  Builder reader_21;
  Builder reader_22;
  Builder reader_23;
  Builder reader_24;
  Builder reader_25;
  Builder reader_26;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected;
  initializer_list<capnp::Data::Reader> expected_00;
  initializer_list<capnp::Text::Reader> expected_01;
  initializer_list<unsigned_long> expected_02;
  initializer_list<unsigned_int> expected_03;
  initializer_list<unsigned_short> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<long> expected_06;
  initializer_list<int> expected_07;
  initializer_list<short> expected_08;
  initializer_list<signed_char> expected_09;
  initializer_list<bool> expected_10;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<capnp::Text::Reader> expected_13;
  initializer_list<double> expected_14;
  initializer_list<float> expected_15;
  initializer_list<unsigned_long> expected_16;
  initializer_list<unsigned_int> expected_17;
  initializer_list<unsigned_short> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<long> expected_20;
  initializer_list<int> expected_21;
  initializer_list<short> expected_22;
  initializer_list<signed_char> expected_23;
  initializer_list<bool> expected_24;
  initializer_list<capnp::Void> expected_25;
  bool bVar1;
  int8_t iVar2;
  uint8_t uVar3;
  int16_t iVar4;
  uint16_t uVar5;
  TestEnum TVar6;
  int32_t iVar7;
  uint32_t uVar8;
  uint uVar9;
  int64_t iVar10;
  uint64_t uVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  TestEnum_9c8e9318b29d9cd3 local_ffc [2];
  iterator local_ff8;
  undefined8 local_ff0;
  Builder local_fe8;
  Builder local_fc0;
  Builder local_f98;
  bool local_f79;
  undefined1 local_f78 [7];
  bool _kj_shouldLog_46;
  Builder local_f50;
  Builder local_f38;
  Builder local_f10;
  bool local_ef1;
  undefined1 local_ef0 [7];
  bool _kj_shouldLog_45;
  Builder local_ec8;
  Builder local_eb0;
  Builder local_e88;
  bool local_e69;
  undefined1 local_e68 [7];
  bool _kj_shouldLog_44;
  Builder local_e40;
  uint local_e28;
  uint local_e24;
  Fault local_e20;
  Fault f_3;
  Builder listReader_3;
  Builder local_db0;
  Reader local_d88;
  Reader RStack_d78;
  Reader RStack_d68;
  iterator local_d58;
  undefined8 local_d50;
  Builder local_d48;
  bool local_d19;
  double dStack_d18;
  bool _kj_shouldLog_43;
  float local_d10;
  bool local_d09;
  double dStack_d08;
  bool _kj_shouldLog_42;
  float local_d00;
  bool local_cf9;
  double dStack_cf8;
  bool _kj_shouldLog_41;
  double local_cf0;
  bool local_ce1;
  uint local_ce0;
  uint uStack_cdc;
  bool _kj_shouldLog_40;
  Fault local_cd8;
  Fault f_2;
  Builder listReader_2;
  float fStack_ca0;
  bool _kj_shouldLog_39;
  bool local_c99;
  float local_c98;
  float fStack_c94;
  bool _kj_shouldLog_38;
  bool local_c8d;
  float local_c8c;
  float fStack_c88;
  bool _kj_shouldLog_37;
  bool local_c81;
  uint local_c80;
  uint uStack_c7c;
  bool _kj_shouldLog_36;
  Fault local_c78;
  Fault f_1;
  Builder listReader_1;
  Builder local_c30;
  uint local_c04;
  iterator local_c00;
  undefined8 local_bf8;
  Builder local_bf0;
  unsigned_short local_bc4 [2];
  iterator local_bc0;
  undefined8 local_bb8;
  Builder local_bb0;
  uchar local_b82 [2];
  iterator local_b80;
  undefined8 local_b78;
  Builder local_b70;
  long local_b48 [2];
  iterator local_b38;
  undefined8 local_b30;
  Builder local_b28;
  int local_b00 [2];
  iterator local_af8;
  undefined8 local_af0;
  Builder local_ae8;
  short local_abc [2];
  iterator local_ab8;
  undefined8 local_ab0;
  Builder local_aa8;
  char local_a7a [2];
  iterator local_a78;
  undefined8 local_a70;
  Builder local_a68;
  bool local_a3c [4];
  iterator local_a38;
  undefined8 local_a30;
  Builder local_a28;
  Builder local_a00;
  uint local_9d4;
  uint local_9d0;
  bool local_9c9;
  undefined1 local_9c8 [7];
  bool _kj_shouldLog_35;
  TestEnum local_99c;
  TestEnum_9c8e9318b29d9cd3 local_99a;
  bool local_997;
  TestEnum_9c8e9318b29d9cd3 local_996 [3];
  bool _kj_shouldLog_34;
  iterator pTStack_990;
  undefined8 local_988;
  Builder local_980;
  Builder local_958;
  Builder local_930;
  bool local_911;
  undefined1 local_910 [7];
  bool _kj_shouldLog_33;
  Builder local_8e8;
  Builder local_8d0;
  Builder local_8a8;
  bool local_889;
  undefined1 local_888 [7];
  bool _kj_shouldLog_32;
  Builder local_860;
  Builder local_848;
  Builder local_820;
  bool local_801;
  undefined1 local_800 [7];
  bool _kj_shouldLog_31;
  Builder local_7d8;
  uint local_7b0;
  uint local_7ac;
  Fault local_7a8;
  Fault f;
  Builder listReader;
  Builder local_738;
  Reader local_710;
  Reader RStack_700;
  Reader RStack_6f0;
  iterator local_6e0;
  undefined8 local_6d8;
  Builder local_6d0;
  double local_6a8 [6];
  iterator local_678;
  undefined8 local_670;
  Builder local_668;
  float local_640 [6];
  iterator local_628;
  undefined8 local_620;
  Builder local_618;
  unsigned_long local_5f0 [4];
  iterator local_5d0;
  undefined8 local_5c8;
  Builder local_5c0;
  uint local_598 [4];
  iterator local_588;
  undefined8 local_580;
  Builder local_578;
  unsigned_short local_550 [4];
  iterator local_548;
  undefined8 local_540;
  Builder local_538;
  uchar local_50c [4];
  iterator local_508;
  undefined8 local_500;
  Builder local_4f8;
  long local_4d0 [4];
  iterator local_4b0;
  undefined8 local_4a8;
  Builder local_4a0;
  int local_478 [4];
  iterator local_468;
  undefined8 local_460;
  Builder local_458;
  short local_430 [4];
  iterator local_428;
  undefined8 local_420;
  Builder local_418;
  char local_3ec [4];
  iterator local_3e8;
  undefined8 local_3e0;
  Builder local_3d8;
  bool local_3ad [5];
  iterator local_3a8;
  undefined8 local_3a0;
  Builder local_398;
  Void local_36b [3];
  iterator local_368;
  undefined8 local_360;
  Builder local_358;
  TestEnum local_32e;
  TestEnum_9c8e9318b29d9cd3 local_32c;
  bool local_329;
  undefined1 local_328 [7];
  bool _kj_shouldLog_30;
  Builder local_300;
  bool local_2e1;
  undefined1 local_2e0 [7];
  bool _kj_shouldLog_29;
  Builder local_2b8;
  Builder local_2a0;
  bool local_281;
  undefined1 local_280 [7];
  bool _kj_shouldLog_28;
  undefined1 local_268 [8];
  Builder subSubReader;
  ArrayPtr<const_unsigned_char> local_230;
  bool local_219;
  undefined1 auStack_218 [7];
  bool _kj_shouldLog_27;
  ArrayPtr<const_unsigned_char> local_208;
  Builder local_1f8;
  bool local_1d9;
  undefined1 local_1d8 [7];
  bool _kj_shouldLog_26;
  int local_1bc;
  double local_1b8;
  bool local_1ad;
  float local_1ac;
  float fStack_1a8;
  bool _kj_shouldLog_25;
  bool local_1a1;
  uint64_t uStack_1a0;
  bool _kj_shouldLog_24;
  unsigned_long_long local_198;
  bool local_18d;
  uint32_t local_18c;
  uint uStack_188;
  bool _kj_shouldLog_23;
  bool local_183;
  uint16_t local_182;
  uint local_180;
  bool _kj_shouldLog_22;
  bool local_17a;
  uint8_t local_179;
  uint local_178;
  bool _kj_shouldLog_21;
  bool local_171;
  int64_t iStack_170;
  bool _kj_shouldLog_20;
  longlong local_168;
  bool local_15d;
  int32_t local_15c;
  int iStack_158;
  bool _kj_shouldLog_19;
  bool local_153;
  int16_t local_152;
  int local_150;
  bool _kj_shouldLog_18;
  bool local_14a;
  int8_t local_149;
  int local_148;
  bool _kj_shouldLog_17;
  bool local_141;
  bool local_140;
  bool local_13f;
  bool local_13e;
  Void local_13c;
  bool local_13b;
  bool _kj_shouldLog_16;
  undefined1 local_138 [2];
  bool _kj_shouldLog_15;
  bool _kj_shouldLog_14;
  Builder subReader;
  ArrayPtr<const_unsigned_char> local_100;
  bool local_e9;
  undefined1 auStack_e8 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_unsigned_char> local_d8;
  Builder local_c8;
  bool local_a9;
  undefined1 local_a8 [7];
  bool _kj_shouldLog_12;
  double local_90;
  double local_88;
  bool local_7d;
  float local_7c;
  float fStack_78;
  bool _kj_shouldLog_11;
  bool local_71;
  uint64_t uStack_70;
  bool _kj_shouldLog_10;
  unsigned_long_long local_68;
  bool local_5d;
  uint32_t local_5c;
  uint uStack_58;
  bool _kj_shouldLog_9;
  bool local_53;
  uint16_t local_52;
  uint local_50;
  bool _kj_shouldLog_8;
  bool local_4a;
  uint8_t local_49;
  uint local_48;
  bool _kj_shouldLog_7;
  bool local_41;
  int64_t iStack_40;
  bool _kj_shouldLog_6;
  longlong local_38;
  bool local_2d;
  int32_t local_2c;
  int iStack_28;
  bool _kj_shouldLog_5;
  bool local_23;
  int16_t local_22;
  int local_20;
  bool _kj_shouldLog_4;
  bool local_1a;
  int8_t local_19;
  int local_18;
  bool _kj_shouldLog_3;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  Void local_c;
  bool local_b;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  
  capnproto_test::capnp::test::TestDefaults::Builder::getVoidField((Builder *)&stack0x00000008);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_b = kj::_::Debug::shouldLog(ERROR);
    while (local_b != false) {
      capnproto_test::capnp::test::TestDefaults::Builder::getVoidField((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xd5,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.getVoidField())\", VOID, reader.getVoidField()"
                 ,(char (*) [51])"failed: expected (VOID) == (reader.getVoidField())",(Void *)&VOID,
                 &local_c);
      local_b = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestDefaults::Builder::getBoolField
                    ((Builder *)&stack0x00000008);
  if (!bVar1) {
    local_e = kj::_::Debug::shouldLog(ERROR);
    while (local_e != false) {
      local_f = true;
      local_10 = capnproto_test::capnp::test::TestDefaults::Builder::getBoolField
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xd6,ERROR,
                 "\"failed: expected \" \"(true) == (reader.getBoolField())\", true, reader.getBoolField()"
                 ,(char (*) [51])"failed: expected (true) == (reader.getBoolField())",&local_f,
                 &local_10);
      local_e = false;
    }
  }
  iVar2 = capnproto_test::capnp::test::TestDefaults::Builder::getInt8Field
                    ((Builder *)&stack0x00000008);
  if (iVar2 != -0x7b) {
    local_11 = kj::_::Debug::shouldLog(ERROR);
    while (local_11 != false) {
      local_18 = -0x7b;
      local_19 = capnproto_test::capnp::test::TestDefaults::Builder::getInt8Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xd7,ERROR,
                 "\"failed: expected \" \"(-123) == (reader.getInt8Field())\", -123, reader.getInt8Field()"
                 ,(char (*) [51])"failed: expected (-123) == (reader.getInt8Field())",&local_18,
                 &local_19);
      local_11 = false;
    }
  }
  iVar4 = capnproto_test::capnp::test::TestDefaults::Builder::getInt16Field
                    ((Builder *)&stack0x00000008);
  if (iVar4 != -0x3039) {
    local_1a = kj::_::Debug::shouldLog(ERROR);
    while (local_1a != false) {
      local_20 = -0x3039;
      local_22 = capnproto_test::capnp::test::TestDefaults::Builder::getInt16Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[54],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xd8,ERROR,
                 "\"failed: expected \" \"(-12345) == (reader.getInt16Field())\", -12345, reader.getInt16Field()"
                 ,(char (*) [54])"failed: expected (-12345) == (reader.getInt16Field())",&local_20,
                 &local_22);
      local_1a = false;
    }
  }
  iVar7 = capnproto_test::capnp::test::TestDefaults::Builder::getInt32Field
                    ((Builder *)&stack0x00000008);
  if (iVar7 != -0xbc614e) {
    local_23 = kj::_::Debug::shouldLog(ERROR);
    while (local_23 != false) {
      iStack_28 = -0xbc614e;
      local_2c = capnproto_test::capnp::test::TestDefaults::Builder::getInt32Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[57],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xd9,ERROR,
                 "\"failed: expected \" \"(-12345678) == (reader.getInt32Field())\", -12345678, reader.getInt32Field()"
                 ,(char (*) [57])"failed: expected (-12345678) == (reader.getInt32Field())",
                 &stack0xffffffffffffffd8,&local_2c);
      local_23 = false;
    }
  }
  iVar10 = capnproto_test::capnp::test::TestDefaults::Builder::getInt64Field
                     ((Builder *)&stack0x00000008);
  if (iVar10 != -0x7048860ddf79) {
    local_2d = kj::_::Debug::shouldLog(ERROR);
    while (local_2d != false) {
      local_38 = -0x7048860ddf79;
      iStack_40 = capnproto_test::capnp::test::TestDefaults::Builder::getInt64Field
                            ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[66],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xda,ERROR,
                 "\"failed: expected \" \"(-123456789012345ll) == (reader.getInt64Field())\", -123456789012345ll, reader.getInt64Field()"
                 ,(char (*) [66])"failed: expected (-123456789012345ll) == (reader.getInt64Field())"
                 ,&local_38,&stack0xffffffffffffffc0);
      local_2d = false;
    }
  }
  uVar3 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt8Field
                    ((Builder *)&stack0x00000008);
  if (uVar3 != 0xea) {
    local_41 = kj::_::Debug::shouldLog(ERROR);
    while (local_41 != false) {
      local_48 = 0xea;
      local_49 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt8Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[52],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"(234u) == (reader.getUInt8Field())\", 234u, reader.getUInt8Field()"
                 ,(char (*) [52])"failed: expected (234u) == (reader.getUInt8Field())",&local_48,
                 &local_49);
      local_41 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt16Field
                    ((Builder *)&stack0x00000008);
  if (uVar5 != 0xb26e) {
    local_4a = kj::_::Debug::shouldLog(ERROR);
    while (local_4a != false) {
      local_50 = 0xb26e;
      local_52 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt16Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(45678u) == (reader.getUInt16Field())\", 45678u, reader.getUInt16Field()"
                 ,(char (*) [55])"failed: expected (45678u) == (reader.getUInt16Field())",&local_50,
                 &local_52);
      local_4a = false;
    }
  }
  uVar8 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt32Field
                    ((Builder *)&stack0x00000008);
  if (uVar8 != 0xce0a6a14) {
    local_53 = kj::_::Debug::shouldLog(ERROR);
    while (local_53 != false) {
      uStack_58 = 0xce0a6a14;
      local_5c = capnproto_test::capnp::test::TestDefaults::Builder::getUInt32Field
                           ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdd,ERROR,
                 "\"failed: expected \" \"(3456789012u) == (reader.getUInt32Field())\", 3456789012u, reader.getUInt32Field()"
                 ,(char (*) [60])"failed: expected (3456789012u) == (reader.getUInt32Field())",
                 &stack0xffffffffffffffa8,&local_5c);
      local_53 = false;
    }
  }
  uVar11 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt64Field
                     ((Builder *)&stack0x00000008);
  if (uVar11 != 0xab54a98ceb1f0ad2) {
    local_5d = kj::_::Debug::shouldLog(ERROR);
    while (local_5d != false) {
      local_68 = 0xab54a98ceb1f0ad2;
      uStack_70 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt64Field
                            ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[72],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xde,ERROR,
                 "\"failed: expected \" \"(12345678901234567890ull) == (reader.getUInt64Field())\", 12345678901234567890ull, reader.getUInt64Field()"
                 ,(char (*) [72])
                  "failed: expected (12345678901234567890ull) == (reader.getUInt64Field())",
                 &local_68,&stack0xffffffffffffff90);
      local_5d = false;
    }
  }
  fVar12 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat32Field
                     ((Builder *)&stack0x00000008);
  bVar1 = kj::_::floatAlmostEqual(fVar12,1234.5);
  if (!bVar1) {
    local_71 = kj::_::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      fStack_78 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat32Field
                            ((Builder *)&stack0x00000008);
      local_7c = 1234.5;
      kj::_::Debug::log<char_const(&)[78],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)\", reader.getFloat32Field(), 1234.5f"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)",
                 &stack0xffffffffffffff88,&local_7c);
      local_71 = false;
    }
  }
  dVar14 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat64Field
                     ((Builder *)&stack0x00000008);
  bVar1 = kj::_::doubleAlmostEqual(dVar14,-1.23e+47);
  if (!bVar1) {
    local_7d = kj::_::Debug::shouldLog(ERROR);
    while (local_7d != false) {
      local_88 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat64Field
                           ((Builder *)&stack0x00000008);
      local_90 = -1.23e+47;
      kj::_::Debug::log<char_const(&)[79],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe0,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)\", reader.getFloat64Field(), -123e45"
                 ,(char (*) [79])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)",
                 &local_88,&local_90);
      local_7d = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getTextField
            ((Builder *)local_a8,(Builder *)&stack0x00000008);
  bVar1 = capnp::operator==("foo",(Builder *)local_a8);
  if (!bVar1) {
    local_a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_a9 != false) {
      capnproto_test::capnp::test::TestDefaults::Builder::getTextField
                (&local_c8,(Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[52],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.getTextField())\", \"foo\", reader.getTextField()"
                 ,(char (*) [52])"failed: expected (\"foo\") == (reader.getTextField())",
                 (char (*) [4])0xa4c8db,&local_c8);
      local_a9 = false;
    }
  }
  local_d8 = (ArrayPtr<const_unsigned_char>)_::data("bar");
  _auStack_e8 = (ArrayPtr<unsigned_char>)
                capnproto_test::capnp::test::TestDefaults::Builder::getDataField
                          ((Builder *)&stack0x00000008);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_d8,
                     (ArrayPtr<unsigned_char> *)auStack_e8);
  if (!bVar1) {
    local_e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_e9 != false) {
      local_100 = (ArrayPtr<const_unsigned_char>)_::data("bar");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestDefaults::Builder::getDataField
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[58],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe2,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.getDataField())\", data(\"bar\"), reader.getDataField()"
                 ,(char (*) [58])"failed: expected (data(\"bar\")) == (reader.getDataField())",
                 (Reader *)&local_100,(Builder *)&subReader._builder.dataSize);
      local_e9 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getStructField
            ((Builder *)local_138,(Builder *)&stack0x00000008);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)local_138);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_13b = kj::_::Debug::shouldLog(ERROR);
    while (local_13b != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[54],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.getVoidField())\", VOID, subReader.getVoidField()"
                 ,(char (*) [54])"failed: expected (VOID) == (subReader.getVoidField())",
                 (Void *)&VOID,&local_13c);
      local_13b = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField((Builder *)local_138);
  if (!bVar1) {
    local_13e = kj::_::Debug::shouldLog(ERROR);
    while (local_13e != false) {
      local_13f = true;
      local_140 = capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[54],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"(true) == (subReader.getBoolField())\", true, subReader.getBoolField()"
                 ,(char (*) [54])"failed: expected (true) == (subReader.getBoolField())",&local_13f,
                 &local_140);
      local_13e = false;
    }
  }
  iVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field((Builder *)local_138);
  if (iVar2 != -0xc) {
    local_141 = kj::_::Debug::shouldLog(ERROR);
    while (local_141 != false) {
      local_148 = -0xc;
      local_149 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[53],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe7,ERROR,
                 "\"failed: expected \" \"(-12) == (subReader.getInt8Field())\", -12, subReader.getInt8Field()"
                 ,(char (*) [53])"failed: expected (-12) == (subReader.getInt8Field())",&local_148,
                 &local_149);
      local_141 = false;
    }
  }
  iVar4 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field((Builder *)local_138);
  if (iVar4 != 0xd80) {
    local_14a = kj::_::Debug::shouldLog(ERROR);
    while (local_14a != false) {
      local_150 = 0xd80;
      local_152 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[55],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe8,ERROR,
                 "\"failed: expected \" \"(3456) == (subReader.getInt16Field())\", 3456, subReader.getInt16Field()"
                 ,(char (*) [55])"failed: expected (3456) == (subReader.getInt16Field())",&local_150
                 ,&local_152);
      local_14a = false;
    }
  }
  iVar7 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field((Builder *)local_138);
  if (iVar7 != -0x4b3eff2) {
    local_153 = kj::_::Debug::shouldLog(ERROR);
    while (local_153 != false) {
      iStack_158 = -0x4b3eff2;
      local_15c = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[60],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe9,ERROR,
                 "\"failed: expected \" \"(-78901234) == (subReader.getInt32Field())\", -78901234, subReader.getInt32Field()"
                 ,(char (*) [60])"failed: expected (-78901234) == (subReader.getInt32Field())",
                 &stack0xfffffffffffffea8,&local_15c);
      local_153 = false;
    }
  }
  iVar10 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field((Builder *)local_138);
  if (iVar10 != 0x33a638e8734e) {
    local_15d = kj::_::Debug::shouldLog(ERROR);
    while (local_15d != false) {
      local_168 = 0x33a638e8734e;
      iStack_170 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                             ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[67],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(56789012345678ll) == (subReader.getInt64Field())\", 56789012345678ll, subReader.getInt64Field()"
                 ,(char (*) [67])
                  "failed: expected (56789012345678ll) == (subReader.getInt64Field())",&local_168,
                 &stack0xfffffffffffffe90);
      local_15d = false;
    }
  }
  uVar3 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field((Builder *)local_138);
  if (uVar3 != 'Z') {
    local_171 = kj::_::Debug::shouldLog(ERROR);
    while (local_171 != false) {
      local_178 = 0x5a;
      local_179 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(90u) == (subReader.getUInt8Field())\", 90u, subReader.getUInt8Field()"
                 ,(char (*) [54])"failed: expected (90u) == (subReader.getUInt8Field())",&local_178,
                 &local_179);
      local_171 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field((Builder *)local_138);
  if (uVar5 != 0x4d2) {
    local_17a = kj::_::Debug::shouldLog(ERROR);
    while (local_17a != false) {
      local_180 = 0x4d2;
      local_182 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(1234u) == (subReader.getUInt16Field())\", 1234u, subReader.getUInt16Field()"
                 ,(char (*) [57])"failed: expected (1234u) == (subReader.getUInt16Field())",
                 &local_180,&local_182);
      local_17a = false;
    }
  }
  uVar8 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field((Builder *)local_138);
  if (uVar8 != 0x3628814) {
    local_183 = kj::_::Debug::shouldLog(ERROR);
    while (local_183 != false) {
      uStack_188 = 0x3628814;
      local_18c = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                            ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[61],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(56789012u) == (subReader.getUInt32Field())\", 56789012u, subReader.getUInt32Field()"
                 ,(char (*) [61])"failed: expected (56789012u) == (subReader.getUInt32Field())",
                 &stack0xfffffffffffffe78,&local_18c);
      local_183 = false;
    }
  }
  uVar11 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field((Builder *)local_138);
  if (uVar11 != 0x4cc1921126f0ad2) {
    local_18d = kj::_::Debug::shouldLog(ERROR);
    while (local_18d != false) {
      local_198 = 0x4cc1921126f0ad2;
      uStack_1a0 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                             ((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[73],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"(345678901234567890ull) == (subReader.getUInt64Field())\", 345678901234567890ull, subReader.getUInt64Field()"
                 ,(char (*) [73])
                  "failed: expected (345678901234567890ull) == (subReader.getUInt64Field())",
                 &local_198,&stack0xfffffffffffffe60);
      local_18d = false;
    }
  }
  fVar12 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field((Builder *)local_138)
  ;
  bVar1 = kj::_::floatAlmostEqual(fVar12,-1.25e-10);
  if (!bVar1) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a1 != false) {
      fStack_1a8 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                             ((Builder *)local_138);
      local_1ac = -1.25e-10;
      kj::_::Debug::log<char_const(&)[84],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)\", subReader.getFloat32Field(), -1.25e-10f"
                 ,(char (*) [84])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)"
                 ,&stack0xfffffffffffffe58,&local_1ac);
      local_1a1 = false;
    }
  }
  dVar14 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field((Builder *)local_138)
  ;
  bVar1 = kj::_::doubleAlmostEqual(dVar14,345.0);
  if (!bVar1) {
    local_1ad = kj::_::Debug::shouldLog(ERROR);
    while (local_1ad != false) {
      local_1b8 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                            ((Builder *)local_138);
      local_1bc = 0x159;
      kj::_::Debug::log<char_const(&)[78],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)\", subReader.getFloat64Field(), 345"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)",
                 &local_1b8,&local_1bc);
      local_1ad = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_1d8,(Builder *)local_138);
  bVar1 = capnp::operator==("baz",(Builder *)local_1d8);
  if (!bVar1) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_1f8,(Builder *)local_138);
      kj::_::Debug::log<char_const(&)[55],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.getTextField())\", \"baz\", subReader.getTextField()"
                 ,(char (*) [55])"failed: expected (\"baz\") == (subReader.getTextField())",
                 (char (*) [4])0xa6d182,&local_1f8);
      local_1d9 = false;
    }
  }
  local_208 = (ArrayPtr<const_unsigned_char>)_::data("qux");
  _auStack_218 = (ArrayPtr<unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                           ((Builder *)local_138);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_208,
                     (ArrayPtr<unsigned_char> *)auStack_218);
  if (!bVar1) {
    local_219 = kj::_::Debug::shouldLog(ERROR);
    while (local_219 != false) {
      local_230 = (ArrayPtr<const_unsigned_char>)_::data("qux");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Builder::getDataField((Builder *)local_138);
      kj::_::Debug::log<char_const(&)[61],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.getDataField())\", data(\"qux\"), subReader.getDataField()"
                 ,(char (*) [61])"failed: expected (data(\"qux\")) == (subReader.getDataField())",
                 (Reader *)&local_230,(Builder *)&subSubReader._builder.dataSize);
      local_219 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)local_268,(Builder *)local_138);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_280,(Builder *)local_268);
  bVar1 = capnp::operator==("nested",(Builder *)local_280);
  if (!bVar1) {
    local_281 = kj::_::Debug::shouldLog(ERROR);
    while (local_281 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_2a0,(Builder *)local_268);
      kj::_::Debug::log<char_const(&)[61],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.getTextField())\", \"nested\", subSubReader.getTextField()"
                 ,(char (*) [61])"failed: expected (\"nested\") == (subSubReader.getTextField())",
                 (char (*) [7])0xa59799,&local_2a0);
      local_281 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)local_2e0,(Builder *)local_268);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_2b8,(Builder *)local_2e0);
  bVar1 = capnp::operator==("really nested",&local_2b8);
  if (!bVar1) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
                ((Builder *)local_328,(Builder *)local_268);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_300,(Builder *)local_328);
      kj::_::Debug::log<char_const(&)[85],char_const(&)[14],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.getStructField().getTextField())\", \"really nested\", subSubReader.getStructField().getTextField()"
                 ,(char (*) [85])
                  "failed: expected (\"really nested\") == (subSubReader.getStructField().getTextField())"
                 ,(char (*) [14])"really nested",&local_300);
      local_2e1 = false;
    }
  }
  TVar6 = capnproto_test::capnp::test::TestAllTypes::Builder::getEnumField((Builder *)local_138);
  if (TVar6 != BAZ) {
    local_329 = kj::_::Debug::shouldLog(ERROR);
    while (local_329 != false) {
      local_32c = BAZ;
      local_32e = capnproto_test::capnp::test::TestAllTypes::Builder::getEnumField
                            ((Builder *)local_138);
      kj::_::Debug::
      log<char_const(&)[63],capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf8,ERROR,
                 "\"failed: expected \" \"(TestEnum::BAZ) == (subReader.getEnumField())\", TestEnum::BAZ, subReader.getEnumField()"
                 ,(char (*) [63])"failed: expected (TestEnum::BAZ) == (subReader.getEnumField())",
                 &local_32c,&local_32e);
      local_329 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList(&local_358,(Builder *)local_138);
  local_368 = local_36b;
  local_360 = 3;
  expected_25._M_len = 3;
  expected_25._M_array = local_368;
  reader_00.builder.capTable = local_358.builder.capTable;
  reader_00.builder.segment = local_358.builder.segment;
  reader_00.builder.ptr = local_358.builder.ptr;
  reader_00.builder.elementCount = local_358.builder.elementCount;
  reader_00.builder.step = local_358.builder.step;
  reader_00.builder.structDataSize = local_358.builder.structDataSize;
  reader_00.builder.structPointerCount = local_358.builder.structPointerCount;
  reader_00.builder.elementSize = local_358.builder.elementSize;
  reader_00.builder._39_1_ = local_358.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_00,expected_25);
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList(&local_398,(Builder *)local_138);
  local_3ad[0] = false;
  local_3ad[1] = true;
  local_3ad[2] = false;
  local_3ad[3] = true;
  local_3ad[4] = true;
  local_3a8 = local_3ad;
  local_3a0 = 5;
  expected_24._M_len = 5;
  expected_24._M_array = local_3a8;
  reader_01.builder.capTable = local_398.builder.capTable;
  reader_01.builder.segment = local_398.builder.segment;
  reader_01.builder.ptr = local_398.builder.ptr;
  reader_01.builder.elementCount = local_398.builder.elementCount;
  reader_01.builder.step = local_398.builder.step;
  reader_01.builder.structDataSize = local_398.builder.structDataSize;
  reader_01.builder.structPointerCount = local_398.builder.structPointerCount;
  reader_01.builder.elementSize = local_398.builder.elementSize;
  reader_01.builder._39_1_ = local_398.builder._39_1_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_01,expected_24);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List(&local_3d8,(Builder *)local_138);
  builtin_strncpy(local_3ec,"\fހ\x7f",4);
  local_3e8 = local_3ec;
  local_3e0 = 4;
  expected_23._M_len = 4;
  expected_23._M_array = local_3e8;
  reader_02.builder.capTable = local_3d8.builder.capTable;
  reader_02.builder.segment = local_3d8.builder.segment;
  reader_02.builder.ptr = local_3d8.builder.ptr;
  reader_02.builder.elementCount = local_3d8.builder.elementCount;
  reader_02.builder.step = local_3d8.builder.step;
  reader_02.builder.structDataSize = local_3d8.builder.structDataSize;
  reader_02.builder.structPointerCount = local_3d8.builder.structPointerCount;
  reader_02.builder.elementSize = local_3d8.builder.elementSize;
  reader_02.builder._39_1_ = local_3d8.builder._39_1_;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Builder,_capnp::List<signed_char,_(capnp::Kind)0>,_false>
            (reader_02,expected_23);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List(&local_418,(Builder *)local_138);
  local_430[0] = 0x4d2;
  local_430[1] = 0xe9d2;
  local_430[2] = 0x8000;
  local_430[3] = 0x7fff;
  local_428 = local_430;
  local_420 = 4;
  expected_22._M_len = 4;
  expected_22._M_array = local_428;
  reader_03.builder.capTable = local_418.builder.capTable;
  reader_03.builder.segment = local_418.builder.segment;
  reader_03.builder.ptr = local_418.builder.ptr;
  reader_03.builder.elementCount = local_418.builder.elementCount;
  reader_03.builder.step = local_418.builder.step;
  reader_03.builder.structDataSize = local_418.builder.structDataSize;
  reader_03.builder.structPointerCount = local_418.builder.structPointerCount;
  reader_03.builder.elementSize = local_418.builder.elementSize;
  reader_03.builder._39_1_ = local_418.builder._39_1_;
  checkList<capnp::List<short,_(capnp::Kind)0>::Builder,_capnp::List<short,_(capnp::Kind)0>,_false>
            (reader_03,expected_22);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List(&local_458,(Builder *)local_138);
  local_478[0] = 0xbc614e;
  local_478[1] = 0xfaa0d340;
  local_478[2] = 0x80000000;
  local_478[3] = 0x7fffffff;
  local_468 = local_478;
  local_460 = 4;
  expected_21._M_len = 4;
  expected_21._M_array = local_468;
  reader_04.builder.capTable = local_458.builder.capTable;
  reader_04.builder.segment = local_458.builder.segment;
  reader_04.builder.ptr = local_458.builder.ptr;
  reader_04.builder.elementCount = local_458.builder.elementCount;
  reader_04.builder.step = local_458.builder.step;
  reader_04.builder.structDataSize = local_458.builder.structDataSize;
  reader_04.builder.structPointerCount = local_458.builder.structPointerCount;
  reader_04.builder.elementSize = local_458.builder.elementSize;
  reader_04.builder._39_1_ = local_458.builder._39_1_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_04,expected_21);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List(&local_4a0,(Builder *)local_138);
  local_4d0[0] = 0x7048860ddf79;
  local_4d0[1] = 0xfffd968afd13752e;
  local_4d0[2] = 0x8000000000000000;
  local_4d0[3] = 0x7fffffffffffffff;
  local_4b0 = local_4d0;
  local_4a8 = 4;
  expected_20._M_len = 4;
  expected_20._M_array = local_4b0;
  reader_05.builder.capTable = local_4a0.builder.capTable;
  reader_05.builder.segment = local_4a0.builder.segment;
  reader_05.builder.ptr = local_4a0.builder.ptr;
  reader_05.builder.elementCount = local_4a0.builder.elementCount;
  reader_05.builder.step = local_4a0.builder.step;
  reader_05.builder.structDataSize = local_4a0.builder.structDataSize;
  reader_05.builder.structPointerCount = local_4a0.builder.structPointerCount;
  reader_05.builder.elementSize = local_4a0.builder.elementSize;
  reader_05.builder._39_1_ = local_4a0.builder._39_1_;
  checkList<capnp::List<long,_(capnp::Kind)0>::Builder,_capnp::List<long,_(capnp::Kind)0>,_false>
            (reader_05,expected_20);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List(&local_4f8,(Builder *)local_138);
  local_50c[0] = '\f';
  local_50c[1] = 0x22;
  local_50c[2] = 0;
  local_50c[3] = 0xff;
  local_508 = local_50c;
  local_500 = 4;
  expected_19._M_len = 4;
  expected_19._M_array = local_508;
  reader_06.builder.capTable = local_4f8.builder.capTable;
  reader_06.builder.segment = local_4f8.builder.segment;
  reader_06.builder.ptr = local_4f8.builder.ptr;
  reader_06.builder.elementCount = local_4f8.builder.elementCount;
  reader_06.builder.step = local_4f8.builder.step;
  reader_06.builder.structDataSize = local_4f8.builder.structDataSize;
  reader_06.builder.structPointerCount = local_4f8.builder.structPointerCount;
  reader_06.builder.elementSize = local_4f8.builder.elementSize;
  reader_06.builder._39_1_ = local_4f8.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_06,expected_19);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List(&local_538,(Builder *)local_138)
  ;
  local_550[0] = 0x4d2;
  local_550[1] = 0x162e;
  local_550[2] = 0;
  local_550[3] = 0xffff;
  local_548 = local_550;
  local_540 = 4;
  expected_18._M_len = 4;
  expected_18._M_array = local_548;
  reader_07.builder.capTable = local_538.builder.capTable;
  reader_07.builder.segment = local_538.builder.segment;
  reader_07.builder.ptr = local_538.builder.ptr;
  reader_07.builder.elementCount = local_538.builder.elementCount;
  reader_07.builder.step = local_538.builder.step;
  reader_07.builder.structDataSize = local_538.builder.structDataSize;
  reader_07.builder.structPointerCount = local_538.builder.structPointerCount;
  reader_07.builder.elementSize = local_538.builder.elementSize;
  reader_07.builder._39_1_ = local_538.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_07,expected_18);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List(&local_578,(Builder *)local_138)
  ;
  local_598[0] = 0xbc614e;
  local_598[1] = 0x55f2cc0;
  local_598[2] = 0;
  local_598[3] = 0xffffffff;
  local_588 = local_598;
  local_580 = 4;
  expected_17._M_len = 4;
  expected_17._M_array = local_588;
  reader_08.builder.capTable = local_578.builder.capTable;
  reader_08.builder.segment = local_578.builder.segment;
  reader_08.builder.ptr = local_578.builder.ptr;
  reader_08.builder.elementCount = local_578.builder.elementCount;
  reader_08.builder.step = local_578.builder.step;
  reader_08.builder.structDataSize = local_578.builder.structDataSize;
  reader_08.builder.structPointerCount = local_578.builder.structPointerCount;
  reader_08.builder.elementSize = local_578.builder.elementSize;
  reader_08.builder._39_1_ = local_578.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_08,expected_17);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List(&local_5c0,(Builder *)local_138)
  ;
  local_5f0[0] = 0x7048860ddf79;
  local_5f0[1] = 0x2697502ec8ad2;
  local_5f0[2] = 0;
  local_5f0[3] = 0xffffffffffffffff;
  local_5d0 = local_5f0;
  local_5c8 = 4;
  expected_16._M_len = 4;
  expected_16._M_array = local_5d0;
  reader_09.builder.capTable = local_5c0.builder.capTable;
  reader_09.builder.segment = local_5c0.builder.segment;
  reader_09.builder.ptr = local_5c0.builder.ptr;
  reader_09.builder.elementCount = local_5c0.builder.elementCount;
  reader_09.builder.step = local_5c0.builder.step;
  reader_09.builder.structDataSize = local_5c0.builder.structDataSize;
  reader_09.builder.structPointerCount = local_5c0.builder.structPointerCount;
  reader_09.builder.elementSize = local_5c0.builder.elementSize;
  reader_09.builder._39_1_ = local_5c0.builder._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_09,expected_16);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            (&local_618,(Builder *)local_138);
  local_640[0] = 0.0;
  local_640[1] = 1234567.0;
  local_640[2] = 1e+37;
  local_640[3] = -1e+37;
  local_640[4] = 1e-37;
  local_640[5] = -1e-37;
  local_628 = local_640;
  local_620 = 6;
  expected_15._M_len = 6;
  expected_15._M_array = local_628;
  reader_10.builder.capTable = local_618.builder.capTable;
  reader_10.builder.segment = local_618.builder.segment;
  reader_10.builder.ptr = local_618.builder.ptr;
  reader_10.builder.elementCount = local_618.builder.elementCount;
  reader_10.builder.step = local_618.builder.step;
  reader_10.builder.structDataSize = local_618.builder.structDataSize;
  reader_10.builder.structPointerCount = local_618.builder.structPointerCount;
  reader_10.builder.elementSize = local_618.builder.elementSize;
  reader_10.builder._39_1_ = local_618.builder._39_1_;
  checkList<capnp::List<float,_(capnp::Kind)0>::Builder,_capnp::List<float,_(capnp::Kind)0>,_false>
            (reader_10,expected_15);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            (&local_668,(Builder *)local_138);
  memcpy(local_6a8,&DAT_00a66a10,0x30);
  local_678 = local_6a8;
  local_670 = 6;
  expected_14._M_len = 6;
  expected_14._M_array = local_678;
  reader_11.builder.capTable = local_668.builder.capTable;
  reader_11.builder.segment = local_668.builder.segment;
  reader_11.builder.ptr = local_668.builder.ptr;
  reader_11.builder.elementCount = local_668.builder.elementCount;
  reader_11.builder.step = local_668.builder.step;
  reader_11.builder.structDataSize = local_668.builder.structDataSize;
  reader_11.builder.structPointerCount = local_668.builder.structPointerCount;
  reader_11.builder.elementSize = local_668.builder.elementSize;
  reader_11.builder._39_1_ = local_668.builder._39_1_;
  checkList<capnp::List<double,_(capnp::Kind)0>::Builder,_capnp::List<double,_(capnp::Kind)0>,_false>
            (reader_11,expected_14);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList(&local_6d0,(Builder *)local_138);
  Text::Reader::Reader(&local_710,"quux");
  Text::Reader::Reader(&RStack_700,"corge");
  Text::Reader::Reader(&RStack_6f0,"grault");
  local_6e0 = &local_710;
  local_6d8 = 3;
  expected_13._M_len = 3;
  expected_13._M_array = local_6e0;
  reader_12.builder.capTable = local_6d0.builder.capTable;
  reader_12.builder.segment = local_6d0.builder.segment;
  reader_12.builder.ptr = local_6d0.builder.ptr;
  reader_12.builder.elementCount = local_6d0.builder.elementCount;
  reader_12.builder.step = local_6d0.builder.step;
  reader_12.builder.structDataSize = local_6d0.builder.structDataSize;
  reader_12.builder.structPointerCount = local_6d0.builder.structPointerCount;
  reader_12.builder.elementSize = local_6d0.builder.elementSize;
  reader_12.builder._39_1_ = local_6d0.builder._39_1_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_12,expected_13);
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList(&local_738,(Builder *)local_138);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("garply");
  _::data("waldo");
  _::data("fred");
  expected_12._M_len = 3;
  expected_12._M_array = (iterator)&listReader.builder.structDataSize;
  reader_13.builder.capTable = local_738.builder.capTable;
  reader_13.builder.segment = local_738.builder.segment;
  reader_13.builder.ptr = local_738.builder.ptr;
  reader_13.builder.elementCount = local_738.builder.elementCount;
  reader_13.builder.step = local_738.builder.step;
  reader_13.builder.structDataSize = local_738.builder.structDataSize;
  reader_13.builder.structPointerCount = local_738.builder.structPointerCount;
  reader_13.builder.elementSize = local_738.builder.elementSize;
  reader_13.builder._39_1_ = local_738.builder._39_1_;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
            (reader_13,expected_12);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)&f,(Builder *)local_138);
  uVar9 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)&f);
  if (uVar9 != 3) {
    local_7ac = 3;
    local_7b0 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                          ((Builder *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_7a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x10b,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",&local_7ac,
               &local_7b0);
    kj::_::Debug::Fault::fatal(&local_7a8);
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_800,(Builder *)&f,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_7d8,(Builder *)local_800);
  bVar1 = capnp::operator==("x structlist 1",&local_7d8);
  if (!bVar1) {
    local_801 = kj::_::Debug::shouldLog(ERROR);
    while (local_801 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_848,(Builder *)&f,0);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_820,&local_848);
      kj::_::Debug::log<char_const(&)[70],char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x10c,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].getTextField())\", \"x structlist 1\", listReader[0].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 1\") == (listReader[0].getTextField())",
                 (char (*) [15])"x structlist 1",&local_820);
      local_801 = false;
    }
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_888,(Builder *)&f,1);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_860,(Builder *)local_888);
  bVar1 = capnp::operator==("x structlist 2",&local_860);
  if (!bVar1) {
    local_889 = kj::_::Debug::shouldLog(ERROR);
    while (local_889 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_8d0,(Builder *)&f,1);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_8a8,&local_8d0);
      kj::_::Debug::log<char_const(&)[70],char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x10d,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].getTextField())\", \"x structlist 2\", listReader[1].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 2\") == (listReader[1].getTextField())",
                 (char (*) [15])"x structlist 2",&local_8a8);
      local_889 = false;
    }
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_910,(Builder *)&f,2);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_8e8,(Builder *)local_910);
  bVar1 = capnp::operator==("x structlist 3",&local_8e8);
  if (!bVar1) {
    local_911 = kj::_::Debug::shouldLog(ERROR);
    while (local_911 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_958,(Builder *)&f,2);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_930,&local_958);
      kj::_::Debug::log<char_const(&)[70],char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x10e,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].getTextField())\", \"x structlist 3\", listReader[2].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 3\") == (listReader[2].getTextField())",
                 (char (*) [15])"x structlist 3",&local_930);
      local_911 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getEnumList(&local_980,(Builder *)local_138);
  local_996[0] = QUX;
  local_996[1] = 1;
  local_996[2] = 6;
  pTStack_990 = local_996;
  local_988 = 3;
  expected_11._M_len = 3;
  expected_11._M_array = pTStack_990;
  reader_14.builder.capTable = local_980.builder.capTable;
  reader_14.builder.segment = local_980.builder.segment;
  reader_14.builder.ptr = local_980.builder.ptr;
  reader_14.builder.elementCount = local_980.builder.elementCount;
  reader_14.builder.step = local_980.builder.step;
  reader_14.builder.structDataSize = local_980.builder.structDataSize;
  reader_14.builder.structPointerCount = local_980.builder.structPointerCount;
  reader_14.builder.elementSize = local_980.builder.elementSize;
  reader_14.builder._39_1_ = local_980.builder._39_1_;
  checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Builder,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_false>
            (reader_14,expected_11);
  TVar6 = capnproto_test::capnp::test::TestDefaults::Builder::getEnumField
                    ((Builder *)&stack0x00000008);
  if (TVar6 != CORGE) {
    local_997 = kj::_::Debug::shouldLog(ERROR);
    while (local_997 != false) {
      local_99a = CORGE;
      local_99c = capnproto_test::capnp::test::TestDefaults::Builder::getEnumField
                            ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[62],capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x112,ERROR,
                 "\"failed: expected \" \"(TestEnum::CORGE) == (reader.getEnumField())\", TestEnum::CORGE, reader.getEnumField()"
                 ,(char (*) [62])"failed: expected (TestEnum::CORGE) == (reader.getEnumField())",
                 &local_99a,&local_99c);
      local_997 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getVoidList
            ((Builder *)local_9c8,(Builder *)&stack0x00000008);
  uVar9 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_9c8);
  if (uVar9 != 6) {
    local_9c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_9c9 != false) {
      local_9d0 = 6;
      capnproto_test::capnp::test::TestDefaults::Builder::getVoidList
                (&local_a00,(Builder *)&stack0x00000008);
      local_9d4 = List<capnp::Void,_(capnp::Kind)0>::Builder::size(&local_a00);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x114,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.getVoidList().size())\", 6u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (6u) == (reader.getVoidList().size())",&local_9d0
                 ,&local_9d4);
      local_9c9 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getBoolList
            (&local_a28,(Builder *)&stack0x00000008);
  local_a3c[0] = true;
  local_a3c[1] = false;
  local_a3c[2] = false;
  local_a3c[3] = true;
  local_a38 = local_a3c;
  local_a30 = 4;
  expected_10._M_len = 4;
  expected_10._M_array = local_a38;
  reader_15.builder.capTable = local_a28.builder.capTable;
  reader_15.builder.segment = local_a28.builder.segment;
  reader_15.builder.ptr = local_a28.builder.ptr;
  reader_15.builder.elementCount = local_a28.builder.elementCount;
  reader_15.builder.step = local_a28.builder.step;
  reader_15.builder.structDataSize = local_a28.builder.structDataSize;
  reader_15.builder.structPointerCount = local_a28.builder.structPointerCount;
  reader_15.builder.elementSize = local_a28.builder.elementSize;
  reader_15.builder._39_1_ = local_a28.builder._39_1_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_15,expected_10);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt8List
            (&local_a68,(Builder *)&stack0x00000008);
  local_a7a[0] = 'o';
  local_a7a[1] = 0x91;
  local_a78 = local_a7a;
  local_a70 = 2;
  expected_09._M_len = 2;
  expected_09._M_array = local_a78;
  reader_16.builder.capTable = local_a68.builder.capTable;
  reader_16.builder.segment = local_a68.builder.segment;
  reader_16.builder.ptr = local_a68.builder.ptr;
  reader_16.builder.elementCount = local_a68.builder.elementCount;
  reader_16.builder.step = local_a68.builder.step;
  reader_16.builder.structDataSize = local_a68.builder.structDataSize;
  reader_16.builder.structPointerCount = local_a68.builder.structPointerCount;
  reader_16.builder.elementSize = local_a68.builder.elementSize;
  reader_16.builder._39_1_ = local_a68.builder._39_1_;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Builder,_capnp::List<signed_char,_(capnp::Kind)0>,_false>
            (reader_16,expected_09);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt16List
            (&local_aa8,(Builder *)&stack0x00000008);
  local_abc[0] = 0x2b67;
  local_abc[1] = 0xd499;
  local_ab8 = local_abc;
  local_ab0 = 2;
  expected_08._M_len = 2;
  expected_08._M_array = local_ab8;
  reader_17.builder.capTable = local_aa8.builder.capTable;
  reader_17.builder.segment = local_aa8.builder.segment;
  reader_17.builder.ptr = local_aa8.builder.ptr;
  reader_17.builder.elementCount = local_aa8.builder.elementCount;
  reader_17.builder.step = local_aa8.builder.step;
  reader_17.builder.structDataSize = local_aa8.builder.structDataSize;
  reader_17.builder.structPointerCount = local_aa8.builder.structPointerCount;
  reader_17.builder.elementSize = local_aa8.builder.elementSize;
  reader_17.builder._39_1_ = local_aa8.builder._39_1_;
  checkList<capnp::List<short,_(capnp::Kind)0>::Builder,_capnp::List<short,_(capnp::Kind)0>,_false>
            (reader_17,expected_08);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt32List
            (&local_ae8,(Builder *)&stack0x00000008);
  local_b00[0] = 0x69f6bc7;
  local_b00[1] = 0xf9609439;
  local_af8 = local_b00;
  local_af0 = 2;
  expected_07._M_len = 2;
  expected_07._M_array = local_af8;
  reader_18.builder.capTable = local_ae8.builder.capTable;
  reader_18.builder.segment = local_ae8.builder.segment;
  reader_18.builder.ptr = local_ae8.builder.ptr;
  reader_18.builder.elementCount = local_ae8.builder.elementCount;
  reader_18.builder.step = local_ae8.builder.step;
  reader_18.builder.structDataSize = local_ae8.builder.structDataSize;
  reader_18.builder.structPointerCount = local_ae8.builder.structPointerCount;
  reader_18.builder.elementSize = local_ae8.builder.elementSize;
  reader_18.builder._39_1_ = local_ae8.builder._39_1_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_18,expected_07);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt64List
            (&local_b28,(Builder *)&stack0x00000008);
  local_b48[0] = 0xf6b75ab2bc471c7;
  local_b48[1] = 0xf0948a54d43b8e39;
  local_b38 = local_b48;
  local_b30 = 2;
  expected_06._M_len = 2;
  expected_06._M_array = local_b38;
  reader_19.builder.capTable = local_b28.builder.capTable;
  reader_19.builder.segment = local_b28.builder.segment;
  reader_19.builder.ptr = local_b28.builder.ptr;
  reader_19.builder.elementCount = local_b28.builder.elementCount;
  reader_19.builder.step = local_b28.builder.step;
  reader_19.builder.structDataSize = local_b28.builder.structDataSize;
  reader_19.builder.structPointerCount = local_b28.builder.structPointerCount;
  reader_19.builder.elementSize = local_b28.builder.elementSize;
  reader_19.builder._39_1_ = local_b28.builder._39_1_;
  checkList<capnp::List<long,_(capnp::Kind)0>::Builder,_capnp::List<long,_(capnp::Kind)0>,_false>
            (reader_19,expected_06);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt8List
            (&local_b70,(Builder *)&stack0x00000008);
  local_b82[0] = 'o';
  local_b82[1] = 0xde;
  local_b80 = local_b82;
  local_b78 = 2;
  expected_05._M_len = 2;
  expected_05._M_array = local_b80;
  reader_20.builder.capTable = local_b70.builder.capTable;
  reader_20.builder.segment = local_b70.builder.segment;
  reader_20.builder.ptr = local_b70.builder.ptr;
  reader_20.builder.elementCount = local_b70.builder.elementCount;
  reader_20.builder.step = local_b70.builder.step;
  reader_20.builder.structDataSize = local_b70.builder.structDataSize;
  reader_20.builder.structPointerCount = local_b70.builder.structPointerCount;
  reader_20.builder.elementSize = local_b70.builder.elementSize;
  reader_20.builder._39_1_ = local_b70.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_20,expected_05);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt16List
            (&local_bb0,(Builder *)&stack0x00000008);
  local_bc4[0] = 0x8235;
  local_bc4[1] = 0xad9c;
  local_bc0 = local_bc4;
  local_bb8 = 2;
  expected_04._M_len = 2;
  expected_04._M_array = local_bc0;
  reader_21.builder.capTable = local_bb0.builder.capTable;
  reader_21.builder.segment = local_bb0.builder.segment;
  reader_21.builder.ptr = local_bb0.builder.ptr;
  reader_21.builder.elementCount = local_bb0.builder.elementCount;
  reader_21.builder.step = local_bb0.builder.step;
  reader_21.builder.structDataSize = local_bb0.builder.structDataSize;
  reader_21.builder.structPointerCount = local_bb0.builder.structPointerCount;
  reader_21.builder.elementSize = local_bb0.builder.elementSize;
  reader_21.builder._39_1_ = local_bb0.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_21,expected_04);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt32List
            (&local_bf0,(Builder *)&stack0x00000008);
  local_c04 = 0xc6aea155;
  local_c00 = &local_c04;
  local_bf8 = 1;
  expected_03._M_len = 1;
  expected_03._M_array = local_c00;
  reader_22.builder.capTable = local_bf0.builder.capTable;
  reader_22.builder.segment = local_bf0.builder.segment;
  reader_22.builder.ptr = local_bf0.builder.ptr;
  reader_22.builder.elementCount = local_bf0.builder.elementCount;
  reader_22.builder.step = local_bf0.builder.step;
  reader_22.builder.structDataSize = local_bf0.builder.structDataSize;
  reader_22.builder.structPointerCount = local_bf0.builder.structPointerCount;
  reader_22.builder.elementSize = local_bf0.builder.elementSize;
  reader_22.builder._39_1_ = local_bf0.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_22,expected_03);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt64List
            (&local_c30,(Builder *)&stack0x00000008);
  listReader_1.builder.structDataSize = 0xb5ac71c7;
  listReader_1.builder.structPointerCount = 0x98af;
  listReader_1.builder.elementSize = 0x32;
  listReader_1.builder._39_1_ = 0x9a;
  expected_02._M_len = 1;
  expected_02._M_array = (iterator)&listReader_1.builder.structDataSize;
  reader_23.builder.capTable = local_c30.builder.capTable;
  reader_23.builder.segment = local_c30.builder.segment;
  reader_23.builder.ptr = local_c30.builder.ptr;
  reader_23.builder.elementCount = local_c30.builder.elementCount;
  reader_23.builder.step = local_c30.builder.step;
  reader_23.builder.structDataSize = local_c30.builder.structDataSize;
  reader_23.builder.structPointerCount = local_c30.builder.structPointerCount;
  reader_23.builder.elementSize = local_c30.builder.elementSize;
  reader_23.builder._39_1_ = local_c30.builder._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_23,expected_02);
  capnproto_test::capnp::test::TestDefaults::Builder::getFloat32List
            ((Builder *)&f_1,(Builder *)&stack0x00000008);
  uVar9 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)&f_1);
  if (uVar9 != 4) {
    uStack_c7c = 4;
    local_c80 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)&f_1);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_c78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x120,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",
               &stack0xfffffffffffff384,&local_c80);
    kj::_::Debug::Fault::fatal(&local_c78);
  }
  fVar12 = List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_1,0);
  if ((fVar12 != 5555.5) || (NAN(fVar12))) {
    local_c81 = kj::_::Debug::shouldLog(ERROR);
    while (local_c81 != false) {
      fStack_c88 = 5555.5;
      local_c8c = List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_1,0);
      kj::_::Debug::log<char_const(&)[46],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x121,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0])\", 5555.5f, listReader[0]",
                 (char (*) [46])"failed: expected (5555.5f) == (listReader[0])",
                 &stack0xfffffffffffff378,&local_c8c);
      local_c81 = false;
    }
  }
  fVar12 = kj::inf();
  fVar13 = List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_1,1);
  if ((fVar12 != fVar13) || (NAN(fVar12) || NAN(fVar13))) {
    local_c8d = kj::_::Debug::shouldLog(ERROR);
    while (local_c8d != false) {
      fStack_c94 = kj::inf();
      local_c98 = List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_1,1);
      kj::_::Debug::log<char_const(&)[48],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x122,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", kj::inf(), listReader[1]"
                 ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                 &stack0xfffffffffffff36c,&local_c98);
      local_c8d = false;
    }
  }
  fVar12 = kj::inf();
  fVar13 = List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_1,2);
  if ((-fVar12 != fVar13) || (NAN(-fVar12) || NAN(fVar13))) {
    local_c99 = kj::_::Debug::shouldLog(ERROR);
    while (local_c99 != false) {
      fStack_ca0 = kj::inf();
      fStack_ca0 = -fStack_ca0;
      listReader_2.builder._36_4_ =
           List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_1,2);
      kj::_::Debug::log<char_const(&)[49],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x123,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", -kj::inf(), listReader[2]"
                 ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                 &stack0xfffffffffffff360,(float *)&listReader_2.builder.structPointerCount);
      local_c99 = false;
    }
  }
  fVar12 = List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_1,3);
  bVar1 = isNaN(fVar12);
  if (!bVar1) {
    listReader_2.builder.structDataSize._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)listReader_2.builder.structDataSize._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x124,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\"",
                 (char (*) [38])"failed: expected isNaN(listReader[3])");
      listReader_2.builder.structDataSize._3_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getFloat64List
            ((Builder *)&f_2,(Builder *)&stack0x00000008);
  uVar9 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)&f_2);
  if (uVar9 != 4) {
    uStack_cdc = 4;
    local_ce0 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)&f_2);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_cd8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x128,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",
               &stack0xfffffffffffff324,&local_ce0);
    kj::_::Debug::Fault::fatal(&local_cd8);
  }
  dVar14 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_2,0);
  if ((dVar14 != 7777.75) || (NAN(dVar14))) {
    local_ce1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ce1 != false) {
      local_cf0 = 7777.75;
      dStack_cf8 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_2,0);
      kj::_::Debug::log<char_const(&)[46],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x129,ERROR,
                 "\"failed: expected \" \"(7777.75) == (listReader[0])\", 7777.75, listReader[0]",
                 (char (*) [46])"failed: expected (7777.75) == (listReader[0])",&local_cf0,
                 &stack0xfffffffffffff308);
      local_ce1 = false;
    }
  }
  fVar12 = kj::inf();
  dVar14 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_2,1);
  if (((double)fVar12 != dVar14) || (NAN((double)fVar12) || NAN(dVar14))) {
    local_cf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_cf9 != false) {
      local_d00 = kj::inf();
      dStack_d08 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_2,1);
      kj::_::Debug::log<char_const(&)[48],float,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x12a,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", kj::inf(), listReader[1]"
                 ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",&local_d00,
                 &stack0xfffffffffffff2f8);
      local_cf9 = false;
    }
  }
  fVar12 = kj::inf();
  dVar14 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_2,2);
  if (((double)-fVar12 != dVar14) || (NAN((double)-fVar12) || NAN(dVar14))) {
    local_d09 = kj::_::Debug::shouldLog(ERROR);
    while (local_d09 != false) {
      local_d10 = kj::inf();
      local_d10 = -local_d10;
      dStack_d18 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_2,2);
      kj::_::Debug::log<char_const(&)[49],float,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,299,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", -kj::inf(), listReader[2]"
                 ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",&local_d10,
                 &stack0xfffffffffffff2e8);
      local_d09 = false;
    }
  }
  dVar14 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&f_2,3);
  bVar1 = isNaN(dVar14);
  if (!bVar1) {
    local_d19 = kj::_::Debug::shouldLog(ERROR);
    while (local_d19 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,300,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\"",
                 (char (*) [38])"failed: expected isNaN(listReader[3])");
      local_d19 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getTextList
            (&local_d48,(Builder *)&stack0x00000008);
  Text::Reader::Reader(&local_d88,"plugh");
  Text::Reader::Reader(&RStack_d78,"xyzzy");
  Text::Reader::Reader(&RStack_d68,"thud");
  local_d58 = &local_d88;
  local_d50 = 3;
  expected_01._M_len = 3;
  expected_01._M_array = local_d58;
  reader_24.builder.capTable = local_d48.builder.capTable;
  reader_24.builder.segment = local_d48.builder.segment;
  reader_24.builder.ptr = local_d48.builder.ptr;
  reader_24.builder.elementCount = local_d48.builder.elementCount;
  reader_24.builder.step = local_d48.builder.step;
  reader_24.builder.structDataSize = local_d48.builder.structDataSize;
  reader_24.builder.structPointerCount = local_d48.builder.structPointerCount;
  reader_24.builder.elementSize = local_d48.builder.elementSize;
  reader_24.builder._39_1_ = local_d48.builder._39_1_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_24,expected_01);
  capnproto_test::capnp::test::TestDefaults::Builder::getDataList
            (&local_db0,(Builder *)&stack0x00000008);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("oops");
  _::data("exhausted");
  _::data("rfc3092");
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&listReader_3.builder.structDataSize;
  reader_25.builder.capTable = local_db0.builder.capTable;
  reader_25.builder.segment = local_db0.builder.segment;
  reader_25.builder.ptr = local_db0.builder.ptr;
  reader_25.builder.elementCount = local_db0.builder.elementCount;
  reader_25.builder.step = local_db0.builder.step;
  reader_25.builder.structDataSize = local_db0.builder.structDataSize;
  reader_25.builder.structPointerCount = local_db0.builder.structPointerCount;
  reader_25.builder.elementSize = local_db0.builder.elementSize;
  reader_25.builder._39_1_ = local_db0.builder._39_1_;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
            (reader_25,expected_00);
  capnproto_test::capnp::test::TestDefaults::Builder::getStructList
            ((Builder *)&f_3,(Builder *)&stack0x00000008);
  uVar9 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)&f_3);
  if (uVar9 != 3) {
    local_e24 = 3;
    local_e28 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                          ((Builder *)&f_3);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_e20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x132,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",&local_e24,
               &local_e28);
    kj::_::Debug::Fault::fatal(&local_e20);
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_e68,(Builder *)&f_3,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_e40,(Builder *)local_e68);
  bVar1 = capnp::operator==("structlist 1",&local_e40);
  if (!bVar1) {
    local_e69 = kj::_::Debug::shouldLog(ERROR);
    while (local_e69 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_eb0,(Builder *)&f_3,0);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_e88,&local_eb0);
      kj::_::Debug::log<char_const(&)[68],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x133,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].getTextField())\", \"structlist 1\", listReader[0].getTextField()"
                 ,(char (*) [68])
                  "failed: expected (\"structlist 1\") == (listReader[0].getTextField())",
                 (char (*) [13])0xa59821,&local_e88);
      local_e69 = false;
    }
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_ef0,(Builder *)&f_3,1);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_ec8,(Builder *)local_ef0);
  bVar1 = capnp::operator==("structlist 2",&local_ec8);
  if (!bVar1) {
    local_ef1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ef1 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_f38,(Builder *)&f_3,1);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_f10,&local_f38);
      kj::_::Debug::log<char_const(&)[68],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x134,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].getTextField())\", \"structlist 2\", listReader[1].getTextField()"
                 ,(char (*) [68])
                  "failed: expected (\"structlist 2\") == (listReader[1].getTextField())",
                 (char (*) [13])0xa59830,&local_f10);
      local_ef1 = false;
    }
  }
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_f78,(Builder *)&f_3,2);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_f50,(Builder *)local_f78);
  bVar1 = capnp::operator==("structlist 3",&local_f50);
  if (!bVar1) {
    local_f79 = kj::_::Debug::shouldLog(ERROR);
    while (local_f79 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_fc0,(Builder *)&f_3,2);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_f98,&local_fc0);
      kj::_::Debug::log<char_const(&)[68],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x135,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].getTextField())\", \"structlist 3\", listReader[2].getTextField()"
                 ,(char (*) [68])
                  "failed: expected (\"structlist 3\") == (listReader[2].getTextField())",
                 (char (*) [13])0xa5983f,&local_f98);
      local_f79 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getEnumList
            (&local_fe8,(Builder *)&stack0x00000008);
  local_ffc[0] = FOO;
  local_ffc[1] = 7;
  local_ff8 = local_ffc;
  local_ff0 = 2;
  expected._M_len = 2;
  expected._M_array = local_ff8;
  reader_26.builder.capTable = local_fe8.builder.capTable;
  reader_26.builder.segment = local_fe8.builder.segment;
  reader_26.builder.ptr = local_fe8.builder.ptr;
  reader_26.builder.elementCount = local_fe8.builder.elementCount;
  reader_26.builder.step = local_fe8.builder.step;
  reader_26.builder.structDataSize = local_fe8.builder.structDataSize;
  reader_26.builder.structPointerCount = local_fe8.builder.structPointerCount;
  reader_26.builder.elementSize = local_fe8.builder.elementSize;
  reader_26.builder._39_1_ = local_fe8.builder._39_1_;
  checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Builder,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_false>
            (reader_26,expected);
  return;
}

Assistant:

void genericCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(true, reader.getBoolField());
  EXPECT_EQ(-123, reader.getInt8Field());
  EXPECT_EQ(-12345, reader.getInt16Field());
  EXPECT_EQ(-12345678, reader.getInt32Field());
  EXPECT_EQ(-123456789012345ll, reader.getInt64Field());
  EXPECT_EQ(234u, reader.getUInt8Field());
  EXPECT_EQ(45678u, reader.getUInt16Field());
  EXPECT_EQ(3456789012u, reader.getUInt32Field());
  EXPECT_EQ(12345678901234567890ull, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(1234.5f, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(-123e45, reader.getFloat64Field());
  EXPECT_EQ("foo", reader.getTextField());
  EXPECT_EQ(data("bar"), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(true, subReader.getBoolField());
    EXPECT_EQ(-12, subReader.getInt8Field());
    EXPECT_EQ(3456, subReader.getInt16Field());
    EXPECT_EQ(-78901234, subReader.getInt32Field());
    EXPECT_EQ(56789012345678ll, subReader.getInt64Field());
    EXPECT_EQ(90u, subReader.getUInt8Field());
    EXPECT_EQ(1234u, subReader.getUInt16Field());
    EXPECT_EQ(56789012u, subReader.getUInt32Field());
    EXPECT_EQ(345678901234567890ull, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(345, subReader.getFloat64Field());
    EXPECT_EQ("baz", subReader.getTextField());
    EXPECT_EQ(data("qux"), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("nested", subSubReader.getTextField());
      EXPECT_EQ("really nested", subSubReader.getStructField().getTextField());
    }
    EXPECT_EQ(TestEnum::BAZ, subReader.getEnumField());

    checkList(subReader.getVoidList(), {VOID, VOID, VOID});
    checkList(subReader.getBoolList(), {false, true, false, true, true});
    checkList(subReader.getInt8List(), {12, -34, -0x80, 0x7f});
    checkList(subReader.getInt16List(), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList(subReader.getInt32List(), {12345678, -90123456, -0x7fffffff - 1, 0x7fffffff});
    checkList(subReader.getInt64List(), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList(subReader.getUInt8List(), {12u, 34u, 0u, 0xffu});
    checkList(subReader.getUInt16List(), {1234u, 5678u, 0u, 0xffffu});
    checkList(subReader.getUInt32List(), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList(subReader.getUInt64List(), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList(subReader.getFloat32List(), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList(subReader.getFloat64List(), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList(subReader.getTextList(), {"quux", "corge", "grault"});
    checkList(subReader.getDataList(), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.getStructList();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].getTextField());
      EXPECT_EQ("x structlist 2", listReader[1].getTextField());
      EXPECT_EQ("x structlist 3", listReader[2].getTextField());
    }
    checkList(subReader.getEnumList(), {TestEnum::QUX, TestEnum::BAR, TestEnum::GRAULT});
  }
  EXPECT_EQ(TestEnum::CORGE, reader.getEnumField());

  EXPECT_EQ(6u, reader.getVoidList().size());
  checkList(reader.getBoolList(), {true, false, false, true});
  checkList(reader.getInt8List(), {111, -111});
  checkList(reader.getInt16List(), {11111, -11111});
  checkList(reader.getInt32List(), {111111111, -111111111});
  checkList(reader.getInt64List(), {1111111111111111111ll, -1111111111111111111ll});
  checkList(reader.getUInt8List(), {111u, 222u});
  checkList(reader.getUInt16List(), {33333u, 44444u});
  checkList(reader.getUInt32List(), {3333333333u});
  checkList(reader.getUInt64List(), {11111111111111111111ull});
  {
    auto listReader = reader.getFloat32List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  {
    auto listReader = reader.getFloat64List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  checkList(reader.getTextList(), {"plugh", "xyzzy", "thud"});
  checkList(reader.getDataList(), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.getStructList();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].getTextField());
    EXPECT_EQ("structlist 2", listReader[1].getTextField());
    EXPECT_EQ("structlist 3", listReader[2].getTextField());
  }
  checkList(reader.getEnumList(), {TestEnum::FOO, TestEnum::GARPLY});
}